

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

void Cnf_CutDeref(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  bool bVar1;
  int local_24;
  Aig_Obj_t *pAStack_20;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Cut_t *pCut_local;
  Cnf_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < pCut->nFanins) {
      pAStack_20 = Aig_ManObj(p->pManAig,*(int *)((long)pCut[1].vIsop + (long)local_24 * 4 + -8));
      bVar1 = pAStack_20 != (Aig_Obj_t *)0x0;
    }
    if (!bVar1) break;
    if ((*(ulong *)&pAStack_20->field_0x18 >> 6 & 0x3ffffff) == 0) {
      __assert_fail("pObj->nRefs > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfCut.c"
                    ,0x8d,"void Cnf_CutDeref(Cnf_Man_t *, Cnf_Cut_t *)");
    }
    *(ulong *)&pAStack_20->field_0x18 =
         *(ulong *)&pAStack_20->field_0x18 & 0xffffffff0000003f |
         ((ulong)(((uint)(*(ulong *)&pAStack_20->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff) <<
         6;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Cnf_CutDeref( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        assert( pObj->nRefs > 0 );
        pObj->nRefs--;
    }
}